

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  size_t sVar2;
  char *buf_ptr;
  char *pcVar3;
  char *pcVar4;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar5;
  type size;
  size_t __n;
  anon_class_8_1_54a39806 decode;
  anon_class_8_1_54a39806 local_48;
  wchar_t *local_40;
  char local_38 [8];
  
  pcVar4 = (char *)s.size_;
  pcVar5 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (wchar_t *)0x0;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_00132c18;
  local_40 = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = local_40;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar3 = pcVar5;
  local_48.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if ((char *)0x3 < pcVar4) {
    ptr = pcVar4;
    do {
      buf_ptr = pcVar3;
      pcVar3 = buf_ptr;
      if (pcVar5 + (long)pcVar4 + -3 <= buf_ptr) goto LAB_0011c3f4;
      pcVar3 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/ext/fmt/include/fmt/format-inl.h:2548:25)>
               ::anon_class_8_1_54a39806::operator()(&local_48,buf_ptr,ptr);
      ptr = extraout_RDX;
    } while (pcVar3 != (char *)0x0);
    pcVar3 = (char *)0x0;
LAB_0011c3f4:
    if (buf_ptr < pcVar5 + (long)pcVar4 + -3) goto LAB_0011c43b;
  }
  __n = (long)(pcVar5 + (long)pcVar4) - (long)pcVar3;
  if (__n != 0) {
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    memcpy(local_38,pcVar3,__n);
    pcVar3 = local_38;
    pcVar4 = extraout_RDX_00;
    do {
      pcVar3 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/ext/fmt/include/fmt/format-inl.h:2548:25)>
               ::anon_class_8_1_54a39806::operator()(&local_48,pcVar3,pcVar4);
      if (pcVar3 == (char *)0x0) break;
      pcVar4 = extraout_RDX_01;
    } while ((long)pcVar3 - (long)local_38 < (long)__n);
  }
LAB_0011c43b:
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ <
      (this->buffer_).super_buffer<wchar_t>.size_ + 1) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
  (this->buffer_).super_buffer<wchar_t>.size_ = sVar2 + 1;
  pwVar1[sVar2] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}